

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chromosome.cpp
# Opt level: O0

void __thiscall Chromosome::mutate(Chromosome *this)

{
  result_type_conflict2 rVar1;
  result_type_conflict2 rVar2;
  size_type sVar3;
  reference pvVar4;
  int mutation;
  int position;
  uniform_int_distribution<int> randomTurnCode;
  uniform_int_distribution<int> randomAccess;
  Chromosome *this_local;
  
  sVar3 = std::vector<TURNCODE,_std::allocator<TURNCODE>_>::size(&this->turnList);
  std::uniform_int_distribution<int>::uniform_int_distribution(&randomTurnCode,0,(int)sVar3 + -1);
  std::uniform_int_distribution<int>::uniform_int_distribution
            ((uniform_int_distribution<int> *)&mutation,0,2);
  rVar1 = std::uniform_int_distribution<int>::operator()(&randomTurnCode,&randomDevice2);
  rVar2 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&mutation,&randomDevice2);
  pvVar4 = std::vector<TURNCODE,_std::allocator<TURNCODE>_>::at(&this->turnList,(long)rVar1);
  *pvVar4 = rVar2 + LEFT;
  this->changed = true;
  setId(this);
  return;
}

Assistant:

void Chromosome::mutate() {
    std::uniform_int_distribution<int> randomAccess(0, (int) turnList.size()-1);
    std::uniform_int_distribution<int> randomTurnCode(0, 2);
    int position = randomAccess(randomDevice2) ;
    int mutation = randomTurnCode(randomDevice2) -1 ;
    turnList.at(position) = (TURNCODE) mutation;

    // Mark as changed for recalculation of fitness, collusion, path etc.
    this->changed = true;
    this->setId();
}